

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_specialspot.cpp
# Opt level: O2

FSerializer * Serialize(FSerializer *arc,char *key,FSpotList *list,FSpotList *def)

{
  bool bVar1;
  FSerializer *pFVar2;
  
  bVar1 = FSerializer::BeginObject(arc,key);
  if (bVar1) {
    pFVar2 = FSerializer::operator()(arc,"type",&list->Type);
    pFVar2 = FSerializer::operator()(pFVar2,"spots",&list->Spots);
    pFVar2 = FSerializer::operator()(pFVar2,"index",&list->Index);
    pFVar2 = FSerializer::operator()(pFVar2,"skipcount",&list->SkipCount);
    pFVar2 = FSerializer::operator()(pFVar2,"numcalls",&list->numcalls);
    FSerializer::EndObject(pFVar2);
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, FSpotList &list, FSpotList *def)
{
	if (arc.BeginObject(key))
	{
		arc("type", list.Type)
			("spots", list.Spots)
			("index", list.Index)
			("skipcount", list.SkipCount)
			("numcalls", list.numcalls)
			.EndObject();
	}
	return arc;
}